

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O1

span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
          (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this,difference_type n)

{
  long in_RDX;
  ptrdiff_t extraout_RDX;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> sVar1;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> ret;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_28;
  
  span_iterator(&local_28,*(span<unsigned_char,__1L> **)n,*(index_type *)(n + 8));
  if (((local_28.span_ != (span<unsigned_char,__1L> *)0x0) &&
      (local_28.index_ = in_RDX + local_28.index_, -1 < local_28.index_)) &&
     (local_28.index_ <= ((local_28.span_)->storage_).super_extent_type<_1L>.size_)) {
    span_iterator(this,local_28.span_,local_28.index_);
    sVar1.index_ = extraout_RDX;
    sVar1.span_ = (span<unsigned_char,__1L> *)this;
    return sVar1;
  }
  assert_failed("span_ && (index_ + n) >= 0 && (index_ + n) <= span_->length ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x96);
}

Assistant:

span_iterator operator+ (difference_type n) const noexcept {
                    auto ret = *this;
                    return ret += n;
                }